

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O0

void chunk_validate_objects(chunk_conflict *c)

{
  loc_conflict grid_00;
  square_conflict *psVar1;
  monster *pmVar2;
  monster_conflict *mon;
  loc grid;
  object *obj;
  wchar_t y;
  wchar_t x;
  chunk_conflict *c_local;
  
  obj._0_4_ = 0;
  do {
    if (c->height <= (int)obj) {
      return;
    }
    for (obj._4_4_ = 0; obj._4_4_ < c->width; obj._4_4_ = obj._4_4_ + 1) {
      grid_00 = (loc_conflict)loc(obj._4_4_,(int)obj);
      for (grid = (loc)square_object((chunk *)c,grid_00); grid != (loc)0x0;
          grid = *(loc *)((long)grid + 0x20)) {
        if (*(char *)((long)grid + 0x3c) == '\0') {
          __assert_fail("obj->tval != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-chunk.c"
                        ,0x23f,"void chunk_validate_objects(struct chunk *)");
        }
      }
      psVar1 = square((chunk *)c,grid_00);
      if ((0 < psVar1->mon) &&
         (pmVar2 = square_monster((chunk *)c,grid_00), pmVar2->held_obj != (object *)0x0)) {
        for (grid = (loc)pmVar2->held_obj; grid != (loc)0x0; grid = *(loc *)((long)grid + 0x20)) {
          if (*(char *)((long)grid + 0x3c) == '\0') {
            __assert_fail("obj->tval != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-chunk.c"
                          ,0x244,"void chunk_validate_objects(struct chunk *)");
          }
        }
      }
    }
    obj._0_4_ = (int)obj + 1;
  } while( true );
}

Assistant:

void chunk_validate_objects(struct chunk *c) {
	int x, y;
	struct object *obj;

	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			struct loc grid = loc(x, y);
			for (obj = square_object(c, grid); obj; obj = obj->next)
				assert(obj->tval != 0);
			if (square(c, grid)->mon > 0) {
				struct monster *mon = square_monster(c, grid);
				if (mon->held_obj)
					for (obj = mon->held_obj; obj; obj = obj->next)
						assert(obj->tval != 0);
			}
		}
	}
}